

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O3

void ImageMipmaps(Image *image)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  Image image_00;
  int iVar4;
  int iVar5;
  int iVar6;
  void *pvVar7;
  int iVar8;
  undefined8 unaff_RBX;
  uint uVar9;
  undefined8 unaff_R12;
  int iVar10;
  undefined8 unaff_R13;
  int iVar11;
  Image imCopy;
  void *local_58;
  Image local_48;
  
  pvVar7 = image->data;
  if (((pvVar7 != (void *)0x0) && (iVar6 = image->width, iVar6 != 0)) &&
     (iVar11 = image->height, iVar11 != 0)) {
    iVar1 = image->format;
    iVar4 = GetPixelDataSize(iVar6,iVar11,iVar1);
    uVar9 = 1;
    if (iVar11 != 1 || iVar6 != 1) {
      do {
        iVar8 = iVar6 / 2;
        if (iVar8 < 2) {
          iVar8 = 1;
        }
        iVar10 = iVar11 / 2;
        if (iVar10 < 2) {
          iVar10 = 1;
        }
        uVar9 = uVar9 + 1;
        iVar5 = GetPixelDataSize(iVar8,iVar10,iVar1);
        iVar4 = iVar4 + iVar5;
        bVar2 = 3 < iVar6;
        bVar3 = 3 < iVar11;
        iVar6 = iVar8;
        iVar11 = iVar10;
      } while (bVar3 || bVar2);
    }
    if ((int)uVar9 <= image->mipmaps) {
      TraceLog(4,"IMAGE: Mipmaps already available");
      return;
    }
    pvVar7 = realloc(pvVar7,(long)iVar4);
    if (pvVar7 == (void *)0x0) {
      TraceLog(4,"IMAGE: Mipmaps required memory could not be allocated");
      pvVar7 = image->data;
    }
    else {
      image->data = pvVar7;
    }
    iVar6 = image->width;
    iVar11 = image->height;
    iVar1 = image->format;
    image_00.width = (int)unaff_R12;
    image_00.height = (int)((ulong)unaff_R12 >> 0x20);
    image_00.data = (void *)unaff_RBX;
    image_00.mipmaps = (int)unaff_R13;
    image_00.format = (int)((ulong)unaff_R13 >> 0x20);
    ImageCopy(image_00);
    if (uVar9 < 2) {
      local_58 = local_48.data;
    }
    else {
      iVar10 = iVar6 / 2;
      iVar8 = iVar11 / 2;
      iVar4 = GetPixelDataSize(iVar10,iVar8,iVar1);
      iVar6 = GetPixelDataSize(iVar6,iVar11,iVar1);
      pvVar7 = (void *)((long)pvVar7 + (long)iVar6);
      iVar6 = uVar9 - 1;
      do {
        ImageResize(&local_48,iVar10,iVar8);
        local_58 = local_48.data;
        memcpy(pvVar7,local_48.data,(long)iVar4);
        pvVar7 = (void *)((long)pvVar7 + (long)iVar4);
        image->mipmaps = image->mipmaps + 1;
        iVar10 = iVar10 / 2;
        iVar8 = iVar8 / 2;
        if (iVar10 < 2) {
          iVar10 = 1;
        }
        if (iVar8 < 2) {
          iVar8 = 1;
        }
        iVar4 = GetPixelDataSize(iVar10,iVar8,image->format);
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
    }
    free(local_58);
  }
  return;
}

Assistant:

void ImageMipmaps(Image *image)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    int mipCount = 1;                   // Required mipmap levels count (including base level)
    int mipWidth = image->width;        // Base image width
    int mipHeight = image->height;      // Base image height
    int mipSize = GetPixelDataSize(mipWidth, mipHeight, image->format);  // Image data size (in bytes)

    // Count mipmap levels required
    while ((mipWidth != 1) || (mipHeight != 1))
    {
        if (mipWidth != 1) mipWidth /= 2;
        if (mipHeight != 1) mipHeight /= 2;

        // Security check for NPOT textures
        if (mipWidth < 1) mipWidth = 1;
        if (mipHeight < 1) mipHeight = 1;

        TRACELOGD("IMAGE: Next mipmap level: %i x %i - current size %i", mipWidth, mipHeight, mipSize);

        mipCount++;
        mipSize += GetPixelDataSize(mipWidth, mipHeight, image->format);       // Add mipmap size (in bytes)
    }

    if (image->mipmaps < mipCount)
    {
        void *temp = RL_REALLOC(image->data, mipSize);

        if (temp != NULL) image->data = temp;      // Assign new pointer (new size) to store mipmaps data
        else TRACELOG(LOG_WARNING, "IMAGE: Mipmaps required memory could not be allocated");

        // Pointer to allocated memory point where store next mipmap level data
        unsigned char *nextmip = (unsigned char *)image->data + GetPixelDataSize(image->width, image->height, image->format);

        mipWidth = image->width/2;
        mipHeight = image->height/2;
        mipSize = GetPixelDataSize(mipWidth, mipHeight, image->format);
        Image imCopy = ImageCopy(*image);

        for (int i = 1; i < mipCount; i++)
        {
            TRACELOGD("IMAGE: Generating mipmap level: %i (%i x %i) - size: %i - offset: 0x%x", i, mipWidth, mipHeight, mipSize, nextmip);

            ImageResize(&imCopy, mipWidth, mipHeight);  // Uses internally Mitchell cubic downscale filter

            memcpy(nextmip, imCopy.data, mipSize);
            nextmip += mipSize;
            image->mipmaps++;

            mipWidth /= 2;
            mipHeight /= 2;

            // Security check for NPOT textures
            if (mipWidth < 1) mipWidth = 1;
            if (mipHeight < 1) mipHeight = 1;

            mipSize = GetPixelDataSize(mipWidth, mipHeight, image->format);
        }

        UnloadImage(imCopy);
    }
    else TRACELOG(LOG_WARNING, "IMAGE: Mipmaps already available");
}